

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_util.h
# Opt level: O0

string * PrintSize_abi_cxx11_(uint64 file_size)

{
  ulong in_RSI;
  string *in_RDI;
  undefined1 auVar1 [16];
  undefined1 auVar2 [64];
  string *res;
  undefined1 extraout_var [56];
  
  auVar2._0_8_ = std::__cxx11::string::string(in_RDI);
  auVar2._8_56_ = extraout_var;
  auVar1 = auVar2._0_16_;
  if (in_RSI < 0x40000001) {
    if (in_RSI < 0x100001) {
      auVar1 = vcvtusi2sd_avx512f(auVar1,in_RSI);
      SStringPrintf((string *)(auVar1._0_8_ * 0.0009765625),(char *)in_RDI,"%.2f KB");
    }
    else {
      auVar1 = vcvtusi2sd_avx512f(auVar1,in_RSI);
      SStringPrintf((string *)(auVar1._0_8_ * 9.5367431640625e-07),(char *)in_RDI,"%.2f MB");
    }
  }
  else {
    auVar1 = vcvtusi2sd_avx512f(auVar1,in_RSI);
    SStringPrintf((string *)(auVar1._0_8_ * 9.313225746154785e-10),(char *)in_RDI,"%.2f GB");
  }
  return in_RDI;
}

Assistant:

inline std::string PrintSize(uint64 file_size) {
  std::string res;
  if (file_size > GB) {
    SStringPrintf(&res, "%.2f GB", (double) file_size / GB);
  } else if (file_size > MB) {
    SStringPrintf(&res, "%.2f MB", (double) file_size / MB);
  } else {
    SStringPrintf(&res, "%.2f KB", (double) file_size / KB);
  }
  return res;
}